

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ParseLibraryImports(Parser *this)

{
  pointer pSVar1;
  pointer pbVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *importName;
  pointer this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range3;
  String name;
  String local_58;
  pointer local_38;
  
  do {
    if (this->m_error != false) {
      return;
    }
    pSVar1 = (this->m_currentSymbol)._M_current;
    if (pSVar1 == (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (pSVar1->type != Import) {
      return;
    }
    this->m_lastLine = pSVar1->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar1 + 1;
    ParseName_abi_cxx11_(&local_58,this);
    if (local_58._M_string_length == 0) {
      Error<>(this,"Expected valid name after \'import\' keyword");
LAB_00126b45:
      bVar5 = false;
    }
    else {
      this_00 = (this->m_importList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->m_importList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_00 == pbVar2) {
LAB_00126ae5:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
        ::push_back(&this->m_importList,&local_58);
        bVar5 = Runtime::LibraryExists
                          ((this->m_runtime).
                           super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,&local_58);
        if (!bVar5) {
          local_38 = local_58._M_dataplus._M_p;
          Error<char_const*>(this,"Could not find library named \'%s\'",&local_38);
          goto LAB_00126b45;
        }
      }
      else {
        bVar4 = 0;
        do {
          bVar3 = bVar4;
          iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                  compare(this_00,&local_58);
          this_00 = this_00 + 1;
          bVar4 = bVar3 | iVar6 == 0;
        } while (this_00 != pbVar2);
        if (!(bool)(bVar3 | iVar6 == 0)) goto LAB_00126ae5;
      }
      bVar5 = true;
      Expect(this,NewLine,(char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      MemFree(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

inline_t void Parser::ParseLibraryImports()
	{
		while (true)
		{
			if (!Accept(SymbolType::Import))
				break;
			auto name = ParseName();
			if (name.empty())
			{
				Error("Expected valid name after 'import' keyword");
				return;
			}

			// Check to make sure we're not adding duplicates
			bool foundDup = false;
			for (auto & importName : m_importList)
			{
				if (importName == name)
				{
					foundDup = true;
					continue;
				}
			}

			// Add library to the list of imported libraries for this script
			if (!foundDup)
			{
				m_importList.push_back(name);
				if (!m_runtime->LibraryExists(name))
				{
					Error("Could not find library named '%s'", name.c_str());
					break;
				}
			}

			Expect(SymbolType::NewLine);
		}
	}